

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov2.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  float *pfVar1;
  char *pcVar2;
  float fVar3;
  pointer pOVar4;
  char cVar5;
  float fVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  float fVar10;
  int i;
  long lVar11;
  __m128 t_2;
  __m128 t;
  allocator local_2dd;
  int baseLine;
  Extractor ex;
  float mean_vals [3];
  Size label_size;
  vector<Object,_std::allocator<Object>_> objects;
  float norm_vals [3];
  float local_270;
  int local_26c;
  undefined1 local_268 [8];
  undefined8 uStack_260;
  undefined8 local_258;
  double dStack_250;
  Mat out;
  Mat in;
  Mat m;
  int local_190;
  int local_18c;
  uchar *local_188;
  Net yolov2;
  
  if (argc == 2) {
    pcVar2 = argv[1];
    std::__cxx11::string::string((string *)&yolov2,pcVar2,(allocator *)&in);
    cv::imread((string *)&m,(int)&yolov2);
    std::__cxx11::string::~string((string *)&yolov2);
    cVar5 = cv::Mat::empty();
    if (cVar5 == '\0') {
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&yolov2);
      yolov2.opt.use_vulkan_compute = true;
      ncnn::Net::load_param(&yolov2,"mobilenet_yolo.param");
      ncnn::Net::load_model(&yolov2,"mobilenet_yolo.bin");
      ncnn::Mat::from_pixels_resize
                (&in,local_188,2,local_18c,local_190,0x1a0,0x1a0,(Allocator *)0x0);
      mean_vals[0] = 1.0;
      mean_vals[1] = 1.0;
      mean_vals[2] = 1.0;
      norm_vals[0] = 0.007843;
      norm_vals[1] = 0.007843;
      norm_vals[2] = 0.007843;
      ncnn::Mat::substract_mean_normalize(&in,(float *)0x0,norm_vals);
      ncnn::Mat::substract_mean_normalize(&in,mean_vals,(float *)0x0);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"data",&in);
      out.cstep = 0;
      out.data = (void *)0x0;
      out.refcount._0_4_ = 0;
      out.refcount._4_4_ = 0;
      out.elemsize._0_4_ = 0;
      out.elemsize._4_4_ = 0;
      out.elempack = 0;
      out.allocator = (Allocator *)0x0;
      out.dims = 0;
      out.w = 0;
      out.h = 0;
      out.d = 0;
      out.c = 0;
      ncnn::Extractor::extract(&ex,"detection_out",&out,0);
      if (objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
          super__Vector_impl_data._M_start) {
        objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.super__Vector_impl_data.
        _M_finish = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      for (lVar11 = 0; lVar11 < out.h; lVar11 = lVar11 + 1) {
        lVar7 = out.w * lVar11 * CONCAT44(out.elemsize._4_4_,(undefined4)out.elemsize);
        local_258 = (double)CONCAT44(*(float *)((long)out.data + lVar7 + 4),
                                     (int)*(float *)((long)out.data + lVar7));
        local_268._0_4_ = *(float *)((long)out.data + lVar7 + 8) * (float)local_18c;
        local_268._4_4_ = *(float *)((long)out.data + lVar7 + 0xc) * (float)local_190;
        uStack_260 = (double)CONCAT44(*(float *)((long)out.data + lVar7 + 0x14) * (float)local_190 -
                                      (float)local_268._4_4_,
                                      *(float *)((long)out.data + lVar7 + 0x10) * (float)local_18c -
                                      (float)local_268._0_4_);
        std::vector<Object,_std::allocator<Object>_>::push_back(&objects,(value_type *)local_268);
      }
      ncnn::Mat::~Mat(&out);
      ncnn::Extractor::~Extractor(&ex);
      ncnn::Mat::~Mat(&in);
      ncnn::Net::~Net(&yolov2);
      cv::Mat::clone();
      lVar11 = 0;
      uVar8 = 0;
      while( true ) {
        pOVar4 = objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                 super__Vector_impl_data._M_start;
        out.refcount = (int *)&in;
        if ((ulong)(((long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)objects.super__Vector_base<Object,_std::allocator<Object>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x18) <= uVar8) break;
        fprintf(_stderr,"%d = %.5f at %.2f %.2f %.2f x %.2f\n",
                SUB84((double)*(float *)((long)&(objects.
                                                 super__Vector_base<Object,_std::allocator<Object>_>
                                                 ._M_impl.super__Vector_impl_data._M_start)->prob +
                                        lVar11),0),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).x +
                                  lVar11),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar11),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).width +
                                  lVar11),
                (double)*(float *)((long)&((objects.
                                            super__Vector_base<Object,_std::allocator<Object>_>.
                                            _M_impl.super__Vector_impl_data._M_start)->rect).height
                                  + lVar11),
                (ulong)*(uint *)((long)&(objects.super__Vector_base<Object,_std::allocator<Object>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->label + lVar11)
               );
        out.elemsize._0_4_ = 0;
        out.elemsize._4_4_ = 0;
        out.data = (void *)CONCAT44(out.data._4_4_,0x3010000);
        pfVar1 = (float *)((long)&(pOVar4->rect).x + lVar11);
        mean_vals[2] = (float)(int)ROUND(pfVar1[2]);
        mean_vals[1] = (float)(int)ROUND(pfVar1[1]);
        mean_vals[0] = (float)(int)ROUND(*pfVar1);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&yolov2);
        yolov2._vptr_Net = (_func_int **)0x406fe00000000000;
        yolov2.opt.lightmode = false;
        yolov2.opt._1_3_ = 0;
        yolov2.opt.num_threads = 0;
        yolov2.opt.blob_allocator = (Allocator *)0x0;
        yolov2.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle(&out,mean_vals,&yolov2,1,8,0);
        sprintf((char *)&yolov2,"%s %.1f%%",
                SUB84((double)(*(float *)((long)&pOVar4->prob + lVar11) * 100.0),0),
                _ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel +
                *(int *)(_ZZL12draw_objectsRKN2cv3MatERKSt6vectorI6ObjectSaIS4_EEE11class_names_rel
                        + (long)*(int *)((long)&pOVar4->label + lVar11) * 4));
        baseLine = 0;
        std::__cxx11::string::string((string *)&out,(char *)&yolov2,(allocator *)&ex);
        cv::getTextSize((string *)&label_size,(int)&out,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)&out);
        fVar6 = (float)(int)*(float *)((long)&(pOVar4->rect).x + lVar11);
        fVar10 = (float)(int)((*(float *)((long)&(pOVar4->rect).y + lVar11) -
                              (float)label_size.height) - (float)baseLine);
        if ((int)fVar10 < 1) {
          fVar10 = 0.0;
        }
        fVar3 = (float)(in.refcount._4_4_ - label_size.width);
        if (label_size.width + (int)fVar6 <= in.refcount._4_4_) {
          fVar3 = fVar6;
        }
        ex._vptr_Extractor._0_4_ = 0x3010000;
        norm_vals[1] = fVar10;
        norm_vals[0] = fVar3;
        norm_vals[2] = (float)label_size.width;
        ex.d = (ExtractorPrivate *)&in;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&out);
        out.data = (void *)0x406fe00000000000;
        out.refcount._0_4_ = 0;
        out.refcount._4_4_ = 0x406fe000;
        out.elemsize._0_4_ = 0;
        out.elemsize._4_4_ = 0x406fe000;
        out.elempack = 0;
        out._28_4_ = 0;
        cv::rectangle(&ex,norm_vals,&out,0xffffffffffffffff,8,0);
        ex._vptr_Extractor._0_4_ = 0x3010000;
        ex.d = (ExtractorPrivate *)&in;
        std::__cxx11::string::string((string *)&out,(char *)&yolov2,&local_2dd);
        local_26c = (int)fVar10 + label_size.height;
        local_270 = fVar3;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_268);
        local_258 = 0.0;
        dStack_250 = 0.0;
        local_268 = (undefined1  [8])0x0;
        uStack_260 = 0.0;
        cv::putText(0,&ex,&out,&local_270,0,(Matx<double,_4,_1> *)local_268,1,8,0);
        std::__cxx11::string::~string((string *)&out);
        uVar8 = uVar8 + 1;
        lVar11 = lVar11 + 0x18;
      }
      std::__cxx11::string::string((string *)&yolov2,"image",(allocator *)&ex);
      out.elemsize._0_4_ = 0;
      out.elemsize._4_4_ = 0;
      out.data = (void *)CONCAT44(out.data._4_4_,0x1010000);
      cv::imshow((string *)&yolov2,(_InputArray *)&out);
      std::__cxx11::string::~string((string *)&yolov2);
      iVar9 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat((Mat *)&in);
      std::_Vector_base<Object,_std::allocator<Object>_>::~_Vector_base
                (&objects.super__Vector_base<Object,_std::allocator<Object>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar2);
      iVar9 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar9 = -1;
  }
  return iVar9;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<Object> objects;
    detect_yolov2(m, objects);

    draw_objects(m, objects);

    return 0;
}